

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpg4d_parser.c
# Opt level: O2

MPP_RET mpg4d_parse_matrix(BitReadCtx_t *gb,RK_U8 *matrix)

{
  RK_S32 RVar1;
  MPP_RET MVar2;
  undefined8 in_RAX;
  ulong uVar3;
  ulong uVar4;
  RK_S32 RVar5;
  undefined8 uStack_38;
  RK_S32 _out;
  
  uVar3 = 0;
  RVar1 = 0;
  uStack_38 = in_RAX;
  do {
    RVar5 = RVar1;
    uVar4 = uVar3;
    MVar2 = mpp_read_bits(gb,8,&_out);
    gb->ret = MVar2;
    uVar3 = (ulong)(uint)MVar2;
    if (MVar2 != MPP_OK) goto LAB_001a8014;
    matrix[uVar4] = (RK_U8)((ulong)uStack_38 >> 0x20);
  } while ((_out != 0) && (uVar3 = uVar4 + 1, RVar1 = _out, uVar4 < 0x3f));
  uVar3 = uVar4 + 1;
  if (_out == 0) {
    for (; uVar3 = uVar4, uVar4 != 0x40; uVar4 = uVar4 + 1) {
      matrix[uVar4] = (RK_U8)RVar5;
    }
  }
LAB_001a8014:
  return (MPP_RET)uVar3;
}

Assistant:

static MPP_RET mpg4d_parse_matrix(BitReadCtx_t *gb, RK_U8 * matrix)
{
    RK_S32 i = 0;
    RK_S32 last, value = 0;

    do {
        last = value;
        READ_BITS(gb, 8, &value);
        matrix[i++] = value;
    } while (value != 0 && i < 64);

    if (value != 0)
        return MPP_ERR_STREAM;

    i--;

    while (i < 64) {
        matrix[i++ ] = last;
    }

    return MPP_OK;

__BITREAD_ERR:
    return MPP_ERR_STREAM;
}